

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IdListIndex(IdList *pList,char *zName)

{
  int iVar1;
  char *in_RSI;
  int *in_RDI;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (*in_RDI <= local_1c) {
      return -1;
    }
    iVar1 = sqlite3StrICmp(*(char **)(in_RDI + (long)local_1c * 2 + 2),in_RSI);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3IdListIndex(IdList *pList, const char *zName){
  int i;
  assert( pList!=0 );
  for(i=0; i<pList->nId; i++){
    if( sqlite3StrICmp(pList->a[i].zName, zName)==0 ) return i;
  }
  return -1;
}